

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.cc
# Opt level: O1

void __thiscall
trng::xoshiro256plus::seed
          (xoshiro256plus *this,result_type s0,result_type s1,result_type s2,result_type s3)

{
  (this->S).r[0] = s0;
  (this->S).r[1] = s1;
  (this->S).r[2] = s2;
  (this->S).r[3] = s3;
  if (((s1 != 0 || s0 != 0) || s2 != 0) || s3 != 0) {
    return;
  }
  (this->S).r[0] = 0x8000000000000000;
  return;
}

Assistant:

void xoshiro256plus::seed(result_type s0, result_type s1, result_type s2, result_type s3) {
    S.r[0] = static_cast<result_type>(s0);
    S.r[1] = static_cast<result_type>(s1);
    S.r[2] = static_cast<result_type>(s2);
    S.r[3] = static_cast<result_type>(s3);
    if (S.r[0] == 0 and S.r[1] == 0 and S.r[2] == 0 and S.r[3] == 0)
      S.r[0] |= result_type(1) << 63u;
  }